

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

shared_ptr<notch::core::ABackpropLayer> __thiscall
notch::core::ConvolutionLayer2D<3UL>::makeClone(ConvolutionLayer2D<3UL> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  runtime_error *this_00;
  int in_ECX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  void *in_R8;
  shared_ptr<notch::core::ConvolutionLayer2D<3UL>_> sVar2;
  shared_ptr<notch::core::ABackpropLayer> sVar3;
  shared_ptr<notch::core::ConvolutionLayer2D<3UL>_> p;
  SharedBuffers local_38;
  
  sVar2 = ::std::
          make_shared<notch::core::ConvolutionLayer2D<3ul>,notch::core::ConvolutionLayer2D<3ul>const&>
                    ((ConvolutionLayer2D<3UL> *)&p);
  if (p.super___shared_ptr<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    SharedBuffers::clone
              (&local_38,(__fn *)(in_RSI + 8),
               sVar2.
               super___shared_ptr<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi,in_ECX,in_R8);
    SharedBuffers::operator=
              (&((p.
                  super___shared_ptr<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_ABackpropLayer).shared,&local_38);
    SharedBuffers::~SharedBuffers(&local_38);
    ::std::make_shared<std::valarray<float>,std::valarray<float>&>((valarray<float> *)&local_38);
    std::__shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((p.
                  super___shared_ptr<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->weights).
                super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.inputBuffer.
                super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::make_shared<std::valarray<float>,std::valarray<float>&>((valarray<float> *)&local_38);
    std::__shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((p.
                  super___shared_ptr<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->bias).
                super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.inputBuffer.
                super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (*(long **)(in_RSI + 0xb8) != (long *)0x0) {
      (**(code **)(**(long **)(in_RSI + 0xb8) + 8))(&local_38);
      ::std::__shared_ptr<notch::core::ALearningPolicy,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<notch::core::ALearningPolicy,(__gnu_cxx::_Lock_policy)2> *)
                 &(p.
                   super___shared_ptr<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->policy,
                 (unique_ptr<notch::core::ALearningPolicy,_std::default_delete<notch::core::ALearningPolicy>_>
                  *)&local_38);
      std::
      unique_ptr<notch::core::ALearningPolicy,_std::default_delete<notch::core::ALearningPolicy>_>::
      ~unique_ptr((unique_ptr<notch::core::ALearningPolicy,_std::default_delete<notch::core::ALearningPolicy>_>
                   *)&local_38);
    }
    _Var1._M_pi = p.
                  super___shared_ptr<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    p.super___shared_ptr<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_ABackpropLayer)._vptr_ABackpropLayer =
         (_func_int **)
         p.super___shared_ptr<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    (this->super_ABackpropLayer).shared.inputBuffer.
    super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var1._M_pi;
    p.super___shared_ptr<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.
                super___shared_ptr<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    sVar3.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar3.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &this->super_ABackpropLayer;
    return (shared_ptr<notch::core::ABackpropLayer>)
           sVar3.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"cannot clone layer");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<ABackpropLayer> makeClone() const {
        auto p = std::make_shared<ConvolutionLayer2D>(*this);
        if (!p) {
            throw std::runtime_error("cannot clone layer");
        }
        p->shared = shared.clone();
        p->weights = std::make_shared<Array>(*weights);
        p->bias = std::make_shared<Array>(*bias);
        if (policy) {
            p->policy = policy->clone();
        }
        return p;
    }